

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_yuv_rgb.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint8_t *rgb;
  uint8_t *rgb_00;
  int iVar5;
  int iVar6;
  uint32_t uVar7;
  uint8_t *puVar8;
  code *yuv2rgb_fun;
  uint uVar9;
  uint8_t *puVar10;
  ulong uVar11;
  uint8_t *puVar12;
  uint uVar13;
  char *pcVar14;
  undefined4 uVar15;
  undefined8 unaff_R12;
  long lVar16;
  ulong uVar17;
  uint8_t *puVar18;
  undefined4 uVar19;
  undefined8 unaff_R13;
  long lVar20;
  uint32_t height;
  uint32_t width;
  uint8_t *local_b0;
  uint8_t *local_a8;
  uint8_t *local_a0;
  uint8_t *local_98;
  uint8_t *local_90;
  uint8_t *local_88;
  uint8_t *local_80;
  uint8_t *local_78;
  uint8_t *local_70;
  uint8_t *RGB;
  uint8_t *YUV;
  ulong local_58;
  uint8_t *local_50;
  char *local_48;
  uint8_t *RGBA;
  undefined4 local_38;
  undefined4 local_34;
  
  if (argc < 4) {
    puts(
        "Usage : test yuv2rgb <yuv image file> <image width> <image height> <output template filename>"
        );
    puts(
        "Or    : test yuv2rgb_nv12 <yuv image file> <image width> <image height> <output template filename>"
        );
    puts(
        "Or    : test yuv2rgb_nv21 <yuv image file> <image width> <image height> <output template filename>"
        );
    puts("Or    : test rgb2yuv <rgb24 binary ppm image file> <output template filename>");
    pcVar14 = "Or    : test rgba2yuv <rgb24 binary ppm image file> <output template filename>";
    goto LAB_00102c38;
  }
  printf("Time will be measured in each configuration for %d iterations...\n",100);
  pcVar14 = argv[1];
  iVar5 = strcmp(pcVar14,"yuv2rgb");
  if (iVar5 == 0) {
    if (argc < 6) {
      pcVar14 = "Invalid argument number for yuv2rgb mode, call without argument to see usage.";
      goto LAB_00102c38;
    }
    uVar15 = 0;
LAB_00102cff:
    uVar19 = 0;
LAB_00102d0a:
    bVar2 = false;
LAB_00102d0c:
    bVar3 = false;
  }
  else {
    iVar6 = strcmp(pcVar14,"yuv2rgb_nv12");
    if (iVar6 == 0) {
      uVar15 = (undefined4)CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
      goto LAB_00102cff;
    }
    iVar6 = strcmp(pcVar14,"yuv2rgb_nv21");
    if (iVar6 == 0) {
      uVar19 = (undefined4)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
      uVar15 = 0;
      goto LAB_00102d0a;
    }
    iVar6 = strcmp(pcVar14,"rgb2yuv");
    if (iVar6 == 0) {
      bVar2 = true;
      uVar15 = 0;
      uVar19 = 0;
      goto LAB_00102d0c;
    }
    iVar6 = strcmp(pcVar14,"rgba2yuv");
    if (iVar6 != 0) {
      pcVar14 = "Invalid mode, call without argument to see usage.";
      goto LAB_00102c38;
    }
    bVar3 = true;
    uVar15 = 0;
    uVar19 = 0;
    bVar2 = false;
  }
  pcVar14 = argv[2];
  YUV = (uint8_t *)0x0;
  RGB = (uint8_t *)0x0;
  if ((byte)((byte)uVar15 | (byte)uVar19 | iVar5 == 0) == 1) {
    uVar7 = atoi(argv[3]);
    width = uVar7;
    height = atoi(argv[4]);
    pcVar1 = argv[5];
    iVar6 = readRawYUV(pcVar14,uVar7,height,&YUV);
    uVar4 = width;
    uVar7 = height;
    if (iVar6 == 0) {
      iVar6 = width * 3;
      uVar11 = (ulong)height;
      local_48 = pcVar1;
      local_38 = uVar19;
      local_34 = uVar15;
      RGB = (uint8_t *)malloc((ulong)(iVar6 * height));
      puVar18 = YUV;
      local_a8 = YUV + uVar7 * uVar4;
      uVar9 = uVar4 + 1 >> 1;
      uVar13 = uVar7 + 1 >> 1;
      local_70 = (uint8_t *)(ulong)(uVar13 * uVar9);
      local_a0 = (uint8_t *)(ulong)((-uVar4 & 0xf) + uVar4);
      local_88 = (uint8_t *)(ulong)((-uVar9 & 0xf) + uVar9);
      if (iVar5 != 0) {
        local_88 = local_a0;
      }
      local_58 = (ulong)((uVar4 * -3 & 0xf) + iVar6);
      lVar16 = uVar11 * (long)local_a0;
      local_90 = (uint8_t *)((ulong)uVar13 * (long)local_88);
      local_50 = RGB;
      iVar6 = posix_memalign(&local_98,0x10,lVar16 + (long)local_90 * 2);
      puVar10 = local_98;
      if (iVar6 != 0) {
        puVar10 = (uint8_t *)0x0;
      }
      local_70 = local_a8 + (long)local_70;
      local_80 = puVar10 + lVar16;
      local_90 = local_80 + (long)local_90;
      uVar11 = (ulong)height;
      local_78 = puVar10;
      if (height != 0) {
        uVar17 = 0;
        do {
          memcpy(puVar10,puVar18 + (int)uVar17 * width,(ulong)width);
          if ((uVar17 & 1) == 0) {
            uVar11 = uVar17 >> 1 & 0x7fffffff;
            lVar16 = (long)local_88 * uVar11;
            puVar12 = local_80 + lVar16;
            iVar6 = (int)uVar11;
            puVar8 = local_a8;
            uVar9 = width;
            if (iVar5 == 0) {
              uVar9 = width + 1 >> 1;
              memcpy(puVar12,local_a8 + uVar9 * iVar6,(ulong)uVar9);
              puVar12 = local_90 + lVar16;
              puVar8 = local_70;
              uVar9 = width + 1 >> 1;
            }
            memcpy(puVar12,puVar8 + iVar6 * uVar9,(ulong)uVar9);
          }
          uVar17 = uVar17 + 1;
          uVar11 = (ulong)height;
          puVar10 = puVar10 + (long)local_a0;
        } while (uVar17 < uVar11);
      }
      puVar10 = local_78;
      iVar6 = posix_memalign(&local_98,0x10,uVar11 * local_58);
      pcVar14 = local_48;
      rgb_00 = local_50;
      puVar8 = local_70;
      puVar12 = local_a8;
      if (iVar6 == 0) {
        local_b0 = local_98;
      }
      else {
        local_b0 = (uint8_t *)0x0;
      }
      if (iVar5 == 0) {
        test_yuv2rgb(width,height,puVar18,local_a8,local_70,width,width + 1 >> 1,local_50,width * 3,
                     YCBCR_601,local_48,"std",100,yuv420_rgb24_std);
        rgb = local_b0;
        test_yuv2rgb(width,height,puVar18,puVar12,puVar8,width,width + 1 >> 1,rgb_00,width * 3,
                     YCBCR_601,pcVar14,"sse2_unaligned",100,yuv420_rgb24_sseu);
        puVar10 = local_78;
        test_yuv2rgb(width,height,local_78,local_80,local_90,(uint32_t)local_a0,(uint32_t)local_88,
                     rgb,(uint32_t)local_58,YCBCR_601,pcVar14,"sse2_aligned",100,yuv420_rgb24_sse);
      }
      else {
        if ((char)local_34 == '\0') {
          if ((char)local_38 == '\0') goto LAB_0010362e;
          test_yuvsp2rgb(width,height,puVar18,local_a8,width,width,local_50,width * 3,YCBCR_601,
                         local_48,"std",100,nv21_rgb24_std);
          puVar8 = local_b0;
          test_yuvsp2rgb(width,height,puVar18,puVar12,width,width,rgb_00,width * 3,YCBCR_601,pcVar14
                         ,"sse2_unaligned",100,nv21_rgb24_sseu);
          yuv2rgb_fun = nv21_rgb24_sse;
        }
        else {
          test_yuvsp2rgb(width,height,puVar18,local_a8,width,width,local_50,width * 3,YCBCR_601,
                         local_48,"std",100,nv12_rgb24_std);
          puVar8 = local_b0;
          test_yuvsp2rgb(width,height,puVar18,puVar12,width,width,rgb_00,width * 3,YCBCR_601,pcVar14
                         ,"sse2_unaligned",100,nv12_rgb24_sseu);
          yuv2rgb_fun = nv12_rgb24_sse;
        }
        puVar10 = local_78;
        test_yuvsp2rgb(width,height,local_78,local_80,(uint32_t)local_a0,(uint32_t)local_88,puVar8,
                       (uint32_t)local_58,YCBCR_601,pcVar14,"sse2_aligned",100,yuv2rgb_fun);
      }
      goto LAB_0010362e;
    }
    pcVar14 = 
    "Error reading image file, check that the file exists and has the correct format and resolution."
    ;
  }
  else {
    if (bVar2) {
      puVar10 = (uint8_t *)argv[3];
      iVar5 = readPPM(pcVar14,&width,&height,&RGB);
      uVar4 = width;
      uVar7 = height;
      if (iVar5 == 0) {
        uVar11 = (ulong)height;
        uVar13 = height * width;
        puVar8 = (uint8_t *)malloc((ulong)(uVar13 * 3 >> 1));
        uVar9 = uVar4 + 1 >> 1;
        puVar12 = (uint8_t *)(ulong)((uVar7 + 1 >> 1) * uVar9);
        local_a0 = (uint8_t *)(ulong)((-uVar4 & 0xf) + uVar4);
        local_a8 = (uint8_t *)(ulong)((-uVar9 & 0xf) + uVar9);
        uVar9 = (uVar4 * -3 & 0xf) + uVar4 * 3;
        YUV = puVar8;
        iVar5 = posix_memalign(&local_98,0x10,uVar11 * uVar9);
        puVar18 = RGB;
        if (iVar5 == 0) {
          local_b0 = local_98;
        }
        else {
          local_b0 = (uint8_t *)0x0;
        }
        local_88 = puVar8 + uVar13;
        uVar11 = (ulong)height;
        local_80 = puVar8;
        local_70 = puVar10;
        if (height != 0) {
          iVar5 = 0;
          uVar17 = 0;
          puVar10 = local_b0;
          local_90 = puVar12;
          do {
            memcpy(puVar10,puVar18 + iVar5 * width,(ulong)(width * 3));
            uVar17 = uVar17 + 1;
            uVar11 = (ulong)height;
            iVar5 = iVar5 + 3;
            puVar10 = puVar10 + uVar9;
            puVar12 = local_90;
          } while (uVar17 < uVar11);
        }
        puVar18 = local_88;
        puVar12 = puVar12 + (long)local_88;
        lVar16 = uVar11 * (long)local_a0;
        lVar20 = (ulong)((int)uVar11 + 1U >> 1) * (long)local_a8;
        iVar5 = posix_memalign(&local_98,0x10,lVar16 + lVar20 * 2);
        puVar8 = local_70;
        puVar10 = local_98;
        if (iVar5 != 0) {
          puVar10 = (uint8_t *)0x0;
        }
        local_90 = RGB;
        test_rgb2yuv(width,height,RGB,width * 3,local_80,puVar18,puVar12,width,width + 1 >> 1,
                     YCBCR_601,(char *)local_70,"std",100,rgb24_yuv420_std);
        test_rgb2yuv(width,height,local_90,width * 3,local_80,local_88,puVar12,width,width + 1 >> 1,
                     YCBCR_601,(char *)puVar8,"sse2_unaligned",100,rgb24_yuv420_sseu);
        test_rgb2yuv(width,height,local_b0,uVar9,puVar10,puVar10 + lVar16,puVar10 + lVar16 + lVar20,
                     (uint32_t)local_a0,(uint32_t)local_a8,YCBCR_601,(char *)puVar8,"sse2_aligned",
                     100,rgb24_yuv420_sse);
        goto LAB_0010362e;
      }
    }
    else {
      if (!bVar3) {
        puVar10 = (uint8_t *)0x0;
        local_b0 = (uint8_t *)0x0;
LAB_0010362e:
        free(local_b0);
        free(puVar10);
        free(RGB);
        free(YUV);
        return 0;
      }
      puVar10 = (uint8_t *)argv[3];
      iVar5 = readPPM(pcVar14,&width,&height,&RGB);
      if (iVar5 == 0) {
        local_b0 = (uint8_t *)0x0;
        RGBA = (uint8_t *)0x0;
        local_a8 = puVar10;
        convert_rgb_to_rgba(RGB,width,height,&RGBA);
        uVar4 = width;
        uVar7 = height;
        uVar17 = (ulong)height;
        uVar13 = height * width;
        local_88 = (uint8_t *)malloc((ulong)(uVar13 * 3 >> 1));
        uVar9 = uVar4 + 1 >> 1;
        uVar11 = (ulong)((uVar7 + 1 >> 1) * uVar9);
        puVar18 = (uint8_t *)(ulong)((-uVar4 & 0xf) + uVar4);
        local_80 = (uint8_t *)(ulong)((-uVar9 & 0xf) + uVar9);
        uVar9 = (uVar4 * -4 & 0xc) + uVar4 * 4;
        YUV = local_88;
        iVar5 = posix_memalign(&local_98,0x10,uVar17 * uVar9);
        puVar10 = RGBA;
        if (iVar5 == 0) {
          local_b0 = local_98;
        }
        local_90 = local_88 + uVar13;
        uVar17 = (ulong)height;
        local_a0 = (uint8_t *)uVar11;
        local_70 = puVar18;
        if (height != 0) {
          iVar5 = 0;
          uVar11 = 0;
          puVar18 = local_b0;
          do {
            memcpy(puVar18,puVar10 + iVar5 * width,(ulong)(width << 2));
            uVar11 = uVar11 + 1;
            uVar17 = (ulong)height;
            iVar5 = iVar5 + 4;
            puVar18 = puVar18 + uVar9;
          } while (uVar11 < uVar17);
        }
        puVar12 = local_90;
        local_a0 = local_90 + (long)local_a0;
        lVar16 = uVar17 * (long)local_70;
        lVar20 = (ulong)((int)uVar17 + 1U >> 1) * (long)local_80;
        iVar5 = posix_memalign(&local_98,0x10,lVar16 + lVar20 * 2);
        puVar8 = local_88;
        puVar18 = local_a0;
        puVar10 = local_98;
        if (iVar5 != 0) {
          puVar10 = (uint8_t *)0x0;
        }
        local_78 = RGBA;
        test_rgb2yuv(width,height,RGBA,width * 4,local_88,puVar12,local_a0,width,width + 1 >> 1,
                     YCBCR_601,(char *)local_a8,"std",100,rgb32_yuv420_std);
        puVar12 = local_a8;
        test_rgb2yuv(width,height,local_78,width * 4,puVar8,local_90,puVar18,width,width + 1 >> 1,
                     YCBCR_601,(char *)local_a8,"sse2_unaligned",100,rgb32_yuv420_sseu);
        test_rgb2yuv(width,height,local_b0,uVar9,puVar10,puVar10 + lVar16,puVar10 + lVar16 + lVar20,
                     (uint32_t)local_70,(uint32_t)local_80,YCBCR_601,(char *)puVar12,"sse2_aligned",
                     100,rgb32_yuv420_sse);
        free(RGBA);
        goto LAB_0010362e;
      }
    }
    pcVar14 = "Error reading image file, check that the file exists and has the correct format.";
  }
LAB_00102c38:
  puts(pcVar14);
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
	if(argc<4)
	{
		printf("Usage : test yuv2rgb <yuv image file> <image width> <image height> <output template filename>\n");
		printf("Or    : test yuv2rgb_nv12 <yuv image file> <image width> <image height> <output template filename>\n");
		printf("Or    : test yuv2rgb_nv21 <yuv image file> <image width> <image height> <output template filename>\n");
		printf("Or    : test rgb2yuv <rgb24 binary ppm image file> <output template filename>\n");
		printf("Or    : test rgba2yuv <rgb24 binary ppm image file> <output template filename>\n");
		return 1;
	}
	
	const int iteration_number = 100;
	printf("Time will be measured in each configuration for %d iterations...\n", iteration_number);
	const YCbCrType yuv_format = YCBCR_601;
	//const YCbCrType yuv_format = YCBCR_709;
	//const YCbCrType yuv_format = YCBCR_JPEG;
	
	Mode mode;
	if(strcmp(argv[1], "yuv2rgb")==0)
	{
		mode=YUV2RGB;
		if(argc<6)
		{
			printf("Invalid argument number for yuv2rgb mode, call without argument to see usage.\n");
			return 1;
		}
	}
	else if(strcmp(argv[1], "yuv2rgb_nv12")==0)
	{
		mode=YUV2RGB_NV12;
	}
	else if(strcmp(argv[1], "yuv2rgb_nv21")==0)
	{
		mode=YUV2RGB_NV21;
	}
	else if(strcmp(argv[1], "rgb2yuv")==0)
	{
		mode=RGB2YUV;
	}
	else if(strcmp(argv[1], "rgba2yuv")==0)
	{
		mode=RGBA2YUV;
	}
	else
	{
		printf("Invalid mode, call without argument to see usage.\n");
		return 1;
	}
	
	const char *filename = argv[2];
	uint32_t width, height;
	const char *out;
	uint8_t *YUV=NULL, *RGB=NULL, *Y=NULL, *U=NULL, *V=NULL, *RGBa=NULL, *YUVa=NULL, *Ya=NULL, *Ua=NULL, *Va=NULL;
	
	if(mode==YUV2RGB || mode==YUV2RGB_NV12 ||  mode==YUV2RGB_NV21)
	{
		//parse argument line
		width = atoi(argv[3]);
		height = atoi(argv[4]);
		out = argv[5];
		
		// read input data and allocate output data
		if(readRawYUV(filename, width, height, &YUV)!=0)
		{
			printf("Error reading image file, check that the file exists and has the correct format and resolution.\n");
			return 1;
		}
		
#if USE_FFMPEG
		yuv2rgb_swscale_ctx = sws_getContext(width, height, AV_PIX_FMT_YUV420P, width, height, AV_PIX_FMT_RGB24, 0, 0, 0, 0);
#endif
		
		RGB = malloc(3*width*height);
		
		Y = YUV;
		U = YUV+width*height;
		V = YUV+width*height+((width+1)/2)*((height+1)/2);
		
		// allocate aligned data
		const size_t y_stride = width + (16-width%16)%16;
		const size_t uv_stride = (mode==YUV2RGB) ? (width+1)/2 + (16-((width+1)/2)%16)%16 : y_stride;
		const size_t rgb_stride = width*3 +(16-(3*width)%16)%16;
	
		const size_t y_size = y_stride*height, uv_size = uv_stride*((height+1)/2);
		YUVa = _mm_malloc(y_size+2*uv_size, 16);
		Ya = YUVa;
		Ua = YUVa+y_size;
		Va = YUVa+y_size+uv_size;
		for(unsigned int i=0; i<height; ++i)
		{
			memcpy(Ya+i*y_stride, Y+i*width, width);
			if((i%2)==0)
			{
				if(mode==YUV2RGB)
				{
					memcpy(Ua+(i/2)*uv_stride, U+(i/2)*((width+1)/2), (width+1)/2);
					memcpy(Va+(i/2)*uv_stride, V+(i/2)*((width+1)/2), (width+1)/2);
				}
				else
				{
					memcpy(Ua+(i/2)*uv_stride, U+(i/2)*width, width);
				}
			}
		}
		
		RGBa = _mm_malloc(rgb_stride*height, 16);
		
		// test all versions
		if(mode==YUV2RGB)
		{
			test_yuv2rgb(width, height, Y, U, V, width, (width+1)/2, RGB, width*3, yuv_format, 
				out, "std", iteration_number, yuv420_rgb24_std);
			test_yuv2rgb(width, height, Y, U, V, width, (width+1)/2, RGB, width*3, yuv_format, 
				out, "sse2_unaligned", iteration_number, yuv420_rgb24_sseu);
#if USE_FFMPEG
			test_yuv2rgb(width, height, Y, U, V, width, (width+1)/2, RGB, width*3, yuv_format, 
				out, "ffmpeg_unaligned", iteration_number, yuv420_rgb24_ffmpeg);
#endif
#if USE_IPP
			test_yuv2rgb(width, height, Y, U, V, width, (width+1)/2, RGB, width*3, yuv_format, 
				out, "ipp_unaligned", iteration_number, yuv420_rgb24_ipp);
#endif
			test_yuv2rgb(width, height, Ya, Ua, Va, y_stride, uv_stride, RGBa, rgb_stride, yuv_format, 
				out, "sse2_aligned", iteration_number, yuv420_rgb24_sse);
#if USE_FFMPEG
			test_yuv2rgb(width, height, Ya, Ua, Va, y_stride, uv_stride, RGBa, rgb_stride, yuv_format, 
				out, "ffmpeg_aligned", iteration_number, yuv420_rgb24_ffmpeg);
#endif
#if USE_IPP
			test_yuv2rgb(width, height, Ya, Ua, Va, y_stride, uv_stride, RGBa, rgb_stride, yuv_format, 
				out, "ipp_aligned", iteration_number, yuv420_rgb24_ipp);
#endif
		}
		else if(mode==YUV2RGB_NV12)
		{
			test_yuvsp2rgb(width, height, Y, U, width, width, RGB, width*3, yuv_format, 
				out, "std", iteration_number, nv12_rgb24_std);
			test_yuvsp2rgb(width, height, Y, U, width, width, RGB, width*3, yuv_format, 
				out, "sse2_unaligned", iteration_number, nv12_rgb24_sseu);
			test_yuvsp2rgb(width, height, Ya, Ua, y_stride, uv_stride, RGBa, rgb_stride, yuv_format, 
				out, "sse2_aligned", iteration_number, nv12_rgb24_sse);
		}
		else if(mode==YUV2RGB_NV21)
		{
			test_yuvsp2rgb(width, height, Y, U, width, width, RGB, width*3, yuv_format, 
				out, "std", iteration_number, nv21_rgb24_std);
			test_yuvsp2rgb(width, height, Y, U, width, width, RGB, width*3, yuv_format, 
				out, "sse2_unaligned", iteration_number, nv21_rgb24_sseu);
			test_yuvsp2rgb(width, height, Ya, Ua, y_stride, uv_stride, RGBa, rgb_stride, yuv_format, 
				out, "sse2_aligned", iteration_number, nv21_rgb24_sse);
		}
	}
	else if(mode==RGB2YUV)
	{
		//parse argument line
		out = argv[3];
		
		// read input data and allocate output data
		if(readPPM(filename, &width, &height, &RGB)!=0)
		{
			printf("Error reading image file, check that the file exists and has the correct format.\n");
			return 1;
		}
		
#if USE_FFMPEG
		rgb2yuv_swscale_ctx = sws_getContext(width, height, AV_PIX_FMT_RGB24, width, height, AV_PIX_FMT_YUV420P, 0, 0, 0, 0);
#endif
		
		YUV = malloc(width*height*3/2);
		
		Y = YUV;
		U = YUV+width*height;
		V = YUV+width*height+((width+1)/2)*((height+1)/2);
		
		// allocate aligned data
		const size_t y_stride = width + (16-width%16)%16,
		uv_stride = (width+1)/2 + (16-((width+1)/2)%16)%16,
		rgb_stride = width*3 +(16-(3*width)%16)%16;
		
		RGBa = _mm_malloc(rgb_stride*height, 16);
		for(unsigned int i=0; i<height; ++i)
		{
			memcpy(RGBa+i*rgb_stride, RGB+i*width*3, width*3);
		}
		
		const size_t y_size = y_stride*height, uv_size = uv_stride*((height+1)/2);
		YUVa = _mm_malloc(y_size+2*uv_size, 16);
		Ya = YUVa;
		Ua = YUVa+y_size;
		Va = YUVa+y_size+uv_size;

		
		// test all versions
		test_rgb2yuv(width, height, RGB, width*3, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "std", iteration_number, rgb24_yuv420_std);
		test_rgb2yuv(width, height, RGB, width*3, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "sse2_unaligned", iteration_number, rgb24_yuv420_sseu);
#if USE_FFMPEG
		test_rgb2yuv(width, height, RGB, width*3, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "ffmpeg_unaligned", iteration_number, rgb24_yuv420_ffmpeg);
#endif
#if USE_IPP
		test_rgb2yuv(width, height, RGB, width*3, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "ipp_unaligned", iteration_number, rgb24_yuv420_ipp);
#endif
		test_rgb2yuv(width, height, RGBa, rgb_stride, Ya, Ua, Va, y_stride, uv_stride, yuv_format, 
			out, "sse2_aligned", iteration_number, rgb24_yuv420_sse);
#if USE_FFMPEG
		test_rgb2yuv(width, height, RGBa, rgb_stride, Ya, Ua, Va, y_stride, uv_stride, yuv_format, 
			out, "ffmpeg_aligned", iteration_number, rgb24_yuv420_ffmpeg);
#endif
#if USE_IPP
		test_rgb2yuv(width, height, RGBa, rgb_stride, Ya, Ua, Va, y_stride, uv_stride, yuv_format, 
			out, "ipp_aligned", iteration_number, rgb24_yuv420_ipp);
#endif
	}
	else if(mode==RGBA2YUV)
	{
		//parse argument line
		out = argv[3];
		
		// read input data and allocate output data
		if(readPPM(filename, &width, &height, &RGB)!=0)
		{
			printf("Error reading image file, check that the file exists and has the correct format.\n");
			return 1;
		}
		// convert rgb to rgba
		uint8_t *RGBA = NULL;
		convert_rgb_to_rgba(RGB, width, height, &RGBA);
		
		YUV = malloc(width*height*3/2);
		
		Y = YUV;
		U = YUV+width*height;
		V = YUV+width*height+((width+1)/2)*((height+1)/2);
		
		// allocate aligned data
		const size_t y_stride = width + (16-width%16)%16,
		uv_stride = (width+1)/2 + (16-((width+1)/2)%16)%16,
		rgba_stride = width*4 +(16-(4*width)%16)%16;
		
		RGBa = _mm_malloc(rgba_stride*height, 16);
		for(unsigned int i=0; i<height; ++i)
		{
			memcpy(RGBa+i*rgba_stride, RGBA+i*width*4, width*4);
		}
		
		const size_t y_size = y_stride*height, uv_size = uv_stride*((height+1)/2);
		YUVa = _mm_malloc(y_size+2*uv_size, 16);
		Ya = YUVa;
		Ua = YUVa+y_size;
		Va = YUVa+y_size+uv_size;
		
		// test all versions
		test_rgb2yuv(width, height, RGBA, width*4, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "std", iteration_number, rgb32_yuv420_std);
		test_rgb2yuv(width, height, RGBA, width*4, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "sse2_unaligned", iteration_number, rgb32_yuv420_sseu);
		test_rgb2yuv(width, height, RGBa, rgba_stride, Ya, Ua, Va, y_stride, uv_stride, yuv_format, 
			out, "sse2_aligned", iteration_number, rgb32_yuv420_sse);
		
		free(RGBA);
	}
	
	_mm_free(RGBa);
	_mm_free(YUVa);
	free(RGB);
	free(YUV);
	
	return 0;
}